

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libunicode.c
# Opt level: O1

int unicode_case1(CharRange *cr,int case_mask)

{
  uint32_t *puVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint *puVar5;
  uint32_t uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  bool bVar12;
  
  if (case_mask == 0) {
    return 0;
  }
  lVar4 = 0;
  puVar5 = &DAT_00189430;
  uVar7 = 0;
  do {
    if (((uint)case_mask >> ((uint)lVar4 & 0x1f) & 1) != 0) {
      uVar7 = uVar7 | *puVar5;
    }
    lVar4 = lVar4 + 1;
    puVar5 = puVar5 + 1;
  } while (lVar4 != 3);
  uVar2 = case_mask & 1;
  bVar12 = (case_mask & 6U) == 0;
  lVar4 = 0;
  do {
    uVar9 = case_conv_table1[lVar4];
    uVar3 = uVar9 >> 4 & 0xf;
    if ((uVar7 >> uVar3 & 1) != 0) {
      uVar11 = uVar9 >> 0xf;
      uVar9 = uVar9 >> 8 & 0x7f;
      if (uVar3 == 5) {
        if (!bVar12 && uVar2 != 0) goto LAB_00176fa2;
        if ((case_mask & 1U) == 0) {
          iVar8 = cr->len + 2;
          if ((cr->size < iVar8) && (iVar8 = cr_realloc(cr,iVar8), iVar8 != 0)) {
            return -1;
          }
          puVar1 = cr->points;
          iVar8 = cr->len;
          cr->len = iVar8 + 1;
          puVar1[iVar8] = uVar11;
          iVar8 = cr->len;
          cr->len = iVar8 + 1;
          puVar1[iVar8] = uVar11 + 1;
        }
        iVar8 = cr->len + 2;
        if ((cr->size < iVar8) && (iVar8 = cr_realloc(cr,iVar8), iVar8 != 0)) {
          return -1;
        }
        uVar6 = uVar11 + 2;
        puVar1 = cr->points;
        iVar8 = cr->len;
        cr->len = iVar8 + 1;
        puVar1[iVar8] = uVar11 + 1;
        iVar8 = cr->len;
        cr->len = iVar8 + 1;
        puVar1[iVar8] = uVar6;
        if ((case_mask & 1U) == 0) goto LAB_00176fe8;
        uVar10 = uVar11 + 3;
        iVar8 = cr->len + 2;
        uVar11 = uVar6;
        if (cr->size < iVar8) {
          iVar8 = cr_realloc(cr,iVar8);
          goto LAB_00176fbf;
        }
      }
      else {
        if ((uVar3 == 4) && (bVar12 || uVar2 == 0)) {
          if (uVar9 != 0) {
            uVar3 = 0;
            do {
              iVar8 = cr->len + 2;
              if ((cr->size < iVar8) && (iVar8 = cr_realloc(cr,iVar8), iVar8 != 0)) {
                return -1;
              }
              puVar1 = cr->points;
              iVar8 = cr->len;
              cr->len = iVar8 + 1;
              puVar1[iVar8] = uVar11 + uVar2 + uVar3;
              iVar8 = cr->len;
              cr->len = iVar8 + 1;
              puVar1[iVar8] = uVar11 + uVar2 + uVar3 + 1;
              uVar3 = uVar3 + 2;
            } while (uVar3 < uVar9);
          }
          goto LAB_00176fe8;
        }
LAB_00176fa2:
        uVar10 = uVar9 + uVar11;
        iVar8 = cr->len + 2;
        if (cr->size < iVar8) {
          iVar8 = cr_realloc(cr,iVar8);
          uVar6 = uVar11;
LAB_00176fbf:
          uVar11 = uVar6;
          if (iVar8 != 0) {
            return -1;
          }
        }
      }
      puVar1 = cr->points;
      iVar8 = cr->len;
      cr->len = iVar8 + 1;
      puVar1[iVar8] = uVar11;
      iVar8 = cr->len;
      cr->len = iVar8 + 1;
      puVar1[iVar8] = uVar10;
    }
LAB_00176fe8:
    lVar4 = lVar4 + 1;
    if (lVar4 == 0x169) {
      return 0;
    }
  } while( true );
}

Assistant:

static int unicode_case1(CharRange *cr, int case_mask)
{
#define MR(x) (1 << RUN_TYPE_ ## x)
    const uint32_t tab_run_mask[3] = {
        MR(U) | MR(UF) | MR(UL) | MR(LSU) | MR(U2L_399_EXT2) | MR(UF_D20) |
        MR(UF_D1_EXT) | MR(U_EXT) | MR(U_EXT2) | MR(U_EXT3),

        MR(L) | MR(LF) | MR(UL) | MR(LSU) | MR(U2L_399_EXT2) | MR(LF_EXT) | MR(L_EXT2),

        MR(UF) | MR(LF) | MR(UL) | MR(LSU) | MR(U2L_399_EXT2) | MR(LF_EXT) | MR(UF_D20) | MR(UF_D1_EXT) | MR(LF_EXT),
    };
#undef MR
    uint32_t mask, v, code, type, len, i, idx;

    if (case_mask == 0)
        return 0;
    mask = 0;
    for(i = 0; i < 3; i++) {
        if ((case_mask >> i) & 1)
            mask |= tab_run_mask[i];
    }
    for(idx = 0; idx < countof(case_conv_table1); idx++) {
        v = case_conv_table1[idx];
        type = (v >> (32 - 17 - 7 - 4)) & 0xf;
        code = v >> (32 - 17);
        len = (v >> (32 - 17 - 7)) & 0x7f;
        if ((mask >> type) & 1) {
            //            printf("%d: type=%d %04x %04x\n", idx, type, code, code + len - 1);
            switch(type) {
            case RUN_TYPE_UL:
                if ((case_mask & CASE_U) && (case_mask & (CASE_L | CASE_F)))
                    goto def_case;
                code += ((case_mask & CASE_U) != 0);
                for(i = 0; i < len; i += 2) {
                    if (cr_add_interval(cr, code + i, code + i + 1))
                        return -1;
                }
                break;
            case RUN_TYPE_LSU:
                if ((case_mask & CASE_U) && (case_mask & (CASE_L | CASE_F)))
                    goto def_case;
                if (!(case_mask & CASE_U)) {
                    if (cr_add_interval(cr, code, code + 1))
                        return -1;
                }
                if (cr_add_interval(cr, code + 1, code + 2))
                    return -1;
                if (case_mask & CASE_U) {
                    if (cr_add_interval(cr, code + 2, code + 3))
                        return -1;
                }
                break;
            default:
            def_case:
                if (cr_add_interval(cr, code, code + len))
                    return -1;
                break;
            }
        }
    }
    return 0;
}